

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::form::~form(form *this)

{
  hold_ptr<cppcms::form::_data> *this_00;
  hold_ptr<cppcms::form::_data> *phVar1;
  reference pvVar2;
  noncopyable *in_RDI;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar3;
  
  *(undefined ***)in_RDI = &PTR_render_0052c3e0;
  uVar3 = 0;
  while( true ) {
    this_00 = (hold_ptr<cppcms::form::_data> *)(ulong)uVar3;
    phVar1 = (hold_ptr<cppcms::form::_data> *)
             std::
             vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ::size((vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                     *)(in_RDI + 8));
    if (phVar1 <= this_00) break;
    pvVar2 = std::
             vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ::operator[]((vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                           *)(in_RDI + 8),(ulong)uVar3);
    if ((pvVar2->second & 1U) != 0) {
      pvVar2 = std::
               vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
               ::operator[]((vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                             *)(in_RDI + 8),(ulong)uVar3);
      if (pvVar2->first != (base_form *)0x0) {
        (*pvVar2->first->_vptr_base_form[7])();
      }
    }
    uVar3 = uVar3 + 1;
  }
  booster::hold_ptr<cppcms::form::_data>::~hold_ptr(this_00);
  std::
  vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
  ::~vector((vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             *)CONCAT44(uVar3,in_stack_fffffffffffffff0));
  base_form::~base_form((base_form *)in_RDI);
  booster::noncopyable::~noncopyable(in_RDI);
  return;
}

Assistant:

form::~form()
{
	for(unsigned i=0;i<elements_.size();i++) {
		if(elements_[i].second)
			delete elements_[i].first;
	}
}